

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall Scene::setCamera(Scene *this,Vector *org,Vector *dir,Vector *up)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  (this->eye).x = org->x;
  (this->eye).y = org->y;
  (this->eye).z = org->z;
  (this->eye_dir).x = dir->x;
  (this->eye_dir).y = dir->y;
  (this->eye_dir).z = dir->z;
  dVar4 = up->y * dir->z - dir->y * up->z;
  dVar2 = up->z * dir->x - dir->z * up->x;
  dVar3 = up->x * dir->y - dir->x * up->y;
  dVar1 = dVar3 * dVar3 + dVar4 * dVar4 + dVar2 * dVar2;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar4 = dVar4 / dVar1;
  dVar2 = dVar2 / dVar1;
  dVar3 = dVar3 / dVar1;
  (this->view_x).x = dVar4;
  (this->view_x).y = dVar2;
  (this->view_x).z = dVar3;
  dVar5 = dir->y * dVar3 - dVar2 * dir->z;
  dVar3 = dir->z * dVar4 - dVar3 * dir->x;
  dVar2 = dVar2 * dir->x - dVar4 * dir->y;
  dVar1 = dVar2 * dVar2 + dVar5 * dVar5 + dVar3 * dVar3;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  (this->view_y).x = dVar5 / dVar1;
  (this->view_y).y = dVar3 / dVar1;
  (this->view_y).z = dVar2 / dVar1;
  return;
}

Assistant:

void Scene::setCamera(const Vector &org, const Vector &dir, const Vector &up)
{
   eye     = org;                  // eye point
   eye_dir = dir;                  // viewing direction
   view_x  = normalize(up ^ dir);  // basis vectors
   view_y  = normalize(dir ^ view_x);
}